

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O2

bool ImportKey(FileTest *t,KeyMap *key_map,_func_EVP_PKEY_ptr_CBS_ptr *parse_func,
              _func_int_CBB_ptr_EVP_PKEY_ptr *marshal_func)

{
  UniquePtr<EVP_PKEY> __p;
  bool bVar1;
  int iVar2;
  string *__x;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *this;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_1;
  UniquePtr<EVP_PKEY> pkey;
  size_t len;
  pointer puStack_140;
  pointer local_138;
  Bytes local_128;
  AssertionResult gtest_ar_;
  size_t len_1;
  AssertionResult gtest_ar__1;
  AssertHelper local_e0;
  ScopedCBB cbb;
  UniquePtr<uint8_t> free_der;
  uint8_t *der;
  string key_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  size_t der_len;
  CBS cbs;
  
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cbb,"Input",(allocator<char> *)&key_type);
  bVar1 = FileTest::GetBytes(t,&input,(string *)&cbb);
  std::__cxx11::string::~string((string *)&cbb);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0025a132;
  }
  cbs.len = (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  cbs.data = input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)(*parse_func)(&cbs);
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
      pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    bVar1 = false;
  }
  else {
    key_type._M_dataplus._M_p = (pointer)&key_type.field_2;
    key_type._M_string_length = 0;
    key_type.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cbb,"Type",(allocator<char> *)&gtest_ar_1);
    bVar1 = FileTest::GetAttribute(t,&key_type,(string *)&cbb);
    std::__cxx11::string::~string((string *)&cbb);
    if (bVar1) {
      bVar1 = std::operator==(&key_type,"RSA");
      if (bVar1) {
        output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 6;
      }
      else {
        bVar1 = std::operator==(&key_type,"EC");
        output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x198;
        if (!bVar1) {
          bVar1 = std::operator==(&key_type,"DSA");
          if (bVar1) {
            output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x74;
          }
          else {
            bVar1 = std::operator==(&key_type,"Ed25519");
            output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0x3b5;
            if (!bVar1) {
              bVar1 = std::operator==(&key_type,"X25519");
              output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0x3b4;
              if (!bVar1) {
                testing::Message::Message((Message *)&gtest_ar_1);
                std::operator<<((ostream *)(CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 0x10),
                                "Unknown key type: ");
                std::operator<<((ostream *)(CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 0x10),
                                (string *)&key_type);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                           ,0x52,"Failed");
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
                if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
                }
                output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0;
              }
            }
          }
        }
      }
      gtest_ar_1._0_4_ =
           EVP_PKEY_id((EVP_PKEY *)
                       pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&cbb,"GetKeyType(t, key_type)","EVP_PKEY_id(pkey.get())",(int *)&output
                 ,(int *)&gtest_ar_1);
      if ((char)cbb.ctx_.child == '\0') {
        testing::Message::Message((Message *)&gtest_ar_1);
        if (cbb.ctx_._8_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)cbb.ctx_._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                   ,0x80,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cbb.ctx_.is_child);
      CBB_zero(&cbb.ctx_);
      iVar2 = CBB_init(&cbb.ctx_,0);
      if (((iVar2 == 0) ||
          (iVar2 = (*marshal_func)(&cbb.ctx_,
                                   (EVP_PKEY *)
                                   pkey._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl),
          iVar2 == 0)) || (iVar2 = CBB_finish(&cbb.ctx_,&der,&der_len), iVar2 == 0)) {
        bVar1 = false;
      }
      else {
        free_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)der;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&output,&input);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar_1,"Output",(allocator<char> *)&len);
        bVar1 = FileTest::HasAttribute(t,(string *)&gtest_ar_1);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar_,"Output",(allocator<char> *)&gtest_ar__1);
          bVar1 = FileTest::GetBytes(t,&output,(string *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&gtest_ar_1);
          if (bVar1) goto LAB_002597b5;
LAB_00259ea0:
          bVar1 = false;
        }
        else {
          std::__cxx11::string::~string((string *)&gtest_ar_1);
LAB_002597b5:
          gtest_ar_._0_8_ =
               CONCAT44(output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )((long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish - gtest_ar_._0_8_);
          len = (size_t)der;
          puStack_140 = (pointer)der_len;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar_1,"Bytes(output)","Bytes(der, der_len)",
                     (Bytes *)&gtest_ar_,(Bytes *)&len);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Re-encoding the key did not match."
                           );
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x92,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar_1,"ExpectNoRawPrivate",(allocator<char> *)&gtest_ar_);
          bVar1 = FileTest::HasAttribute(t,(string *)&gtest_ar_1);
          std::__cxx11::string::~string((string *)&gtest_ar_1);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar_1,"ExpectRawPrivate",(allocator<char> *)&gtest_ar_);
            bVar1 = FileTest::HasAttribute(t,(string *)&gtest_ar_1);
            std::__cxx11::string::~string((string *)&gtest_ar_1);
            if (!bVar1) goto LAB_00259c34;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar_1,"ExpectRawPrivate",(allocator<char> *)&len);
            bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &gtest_ar_,(string *)&gtest_ar_1);
            std::__cxx11::string::~string((string *)&gtest_ar_1);
            if (bVar1) {
              len = 0;
              puStack_140 = (pointer)0x0;
              local_138 = (pointer)0x0;
              iVar2 = EVP_PKEY_get_raw_private_key
                                ((EVP_PKEY *)
                                 pkey._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                 (uint8_t *)0x0,&len_1);
              if (iVar2 != 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,len_1);
                iVar2 = EVP_PKEY_get_raw_private_key
                                  ((EVP_PKEY *)
                                   pkey._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                   (uint8_t *)len,&len_1);
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,len_1);
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )((long)puStack_140 - len);
                  gtest_ar__1._0_8_ = len;
                  local_128.span_.size_ =
                       (long)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl - gtest_ar_._0_8_;
                  local_128.span_.data_ = (uchar *)gtest_ar_._0_8_;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)&gtest_ar_1,"Bytes(raw)","Bytes(expected)",
                             (Bytes *)&gtest_ar__1,&local_128);
                  if (gtest_ar_1.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar__1);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_128,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xa8,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_128,(Message *)&gtest_ar__1);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                    if (gtest_ar__1._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_1.message_);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,len_1 - 1
                            );
                  len_1 = (long)puStack_140 - len;
                  iVar2 = EVP_PKEY_get_raw_private_key
                                    ((EVP_PKEY *)
                                     pkey._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                     (uint8_t *)len,&len_1);
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar__1.success_ = iVar2 == 0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_128);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_1,(internal *)&gtest_ar__1,
                               (AssertionResult *)
                               "EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)","true",
                               "false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_e0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                               ,0xad,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
                    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_128);
                    testing::internal::AssertHelper::~AssertHelper(&local_e0);
                    std::__cxx11::string::~string((string *)&gtest_ar_1);
                    if ((long *)local_128.span_.data_ != (long *)0x0) {
                      (**(code **)(*(long *)local_128.span_.data_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__1.message_);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &gtest_ar_);
                  goto LAB_00259c34;
                }
              }
              goto LAB_00259e8c;
            }
LAB_00259e96:
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
            goto LAB_00259ea0;
          }
          iVar2 = EVP_PKEY_get_raw_private_key
                            ((EVP_PKEY *)
                             pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,(uint8_t *)0x0
                             ,&len);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 == 0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)&gtest_ar__1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                       (AssertionResult *)"EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_128,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x97,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_128,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
            std::__cxx11::string::~string((string *)&gtest_ar_1);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
LAB_00259c34:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar_1,"ExpectNoRawPublic",(allocator<char> *)&gtest_ar_);
          bVar1 = FileTest::HasAttribute(t,(string *)&gtest_ar_1);
          std::__cxx11::string::~string((string *)&gtest_ar_1);
          if (bVar1) {
            iVar2 = EVP_PKEY_get_raw_public_key
                              ((EVP_PKEY *)
                               pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                               ._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                               (uint8_t *)0x0,&len);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 == 0;
            if (iVar2 != 0) {
              testing::Message::Message((Message *)&gtest_ar__1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                         (AssertionResult *)"EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_128,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0xb2,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_128,(Message *)&gtest_ar__1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              if (gtest_ar__1._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar_1,"ExpectRawPublic",(allocator<char> *)&gtest_ar_);
            bVar1 = FileTest::HasAttribute(t,(string *)&gtest_ar_1);
            std::__cxx11::string::~string((string *)&gtest_ar_1);
            if (bVar1) {
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar_1,"ExpectRawPublic",(allocator<char> *)&len);
              bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &gtest_ar_,(string *)&gtest_ar_1);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              if (bVar1) {
                len = 0;
                puStack_140 = (pointer)0x0;
                local_138 = (pointer)0x0;
                iVar2 = EVP_PKEY_get_raw_public_key
                                  ((EVP_PKEY *)
                                   pkey._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                   (uint8_t *)0x0,&len_1);
                if (iVar2 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,len_1);
                  iVar2 = EVP_PKEY_get_raw_public_key
                                    ((EVP_PKEY *)
                                     pkey._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                     (uint8_t *)len,&len_1);
                  if (iVar2 != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,len_1);
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )((long)puStack_140 - len);
                    gtest_ar__1._0_8_ = len;
                    local_128.span_.size_ =
                         (long)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl - gtest_ar_._0_8_;
                    local_128.span_.data_ = (uchar *)gtest_ar_._0_8_;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)&gtest_ar_1,"Bytes(raw)","Bytes(expected)",
                               (Bytes *)&gtest_ar__1,&local_128);
                    if (gtest_ar_1.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar__1);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_128,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,0xc3,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_128,(Message *)&gtest_ar__1);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                      if (gtest_ar__1._0_8_ != 0) {
                        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_1.message_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,
                               len_1 - 1);
                    len_1 = (long)puStack_140 - len;
                    iVar2 = EVP_PKEY_get_raw_public_key
                                      ((EVP_PKEY *)
                                       pkey._M_t.
                                       super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
                                       (uint8_t *)len,&len_1);
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    gtest_ar__1.success_ = iVar2 == 0;
                    if (iVar2 != 0) {
                      testing::Message::Message((Message *)&local_128);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_1,(internal *)&gtest_ar__1,
                                 (AssertionResult *)
                                 "EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)","true",
                                 "false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_e0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                                 ,200,(char *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_));
                      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_128);
                      testing::internal::AssertHelper::~AssertHelper(&local_e0);
                      std::__cxx11::string::~string((string *)&gtest_ar_1);
                      if ((long *)local_128.span_.data_ != (long *)0x0) {
                        (**(code **)(*(long *)local_128.span_.data_ + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar__1.message_);
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar_);
                    goto LAB_00259ff7;
                  }
                }
LAB_00259e8c:
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
              }
              goto LAB_00259e96;
            }
          }
LAB_00259ff7:
          __x = FileTest::GetParameter_abi_cxx11_(t);
          len = len & 0xffffffff00000000;
          gtest_ar_._0_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
               ::count(key_map,__x);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)&gtest_ar_1,"0u","key_map->count(key_name)",(uint *)&len,
                     (unsigned_long *)&gtest_ar_);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Duplicate key: ");
            std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),(string *)__x);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0xcd,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          this = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                 ::operator[](key_map,__x);
          __p = pkey;
          pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                    (this,(pointer)__p._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
          bVar1 = true;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_der);
      }
      bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&key_type);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pkey);
LAB_0025a132:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

static bool ImportKey(FileTest *t, KeyMap *key_map,
                      EVP_PKEY *(*parse_func)(CBS *cbs),
                      int (*marshal_func)(CBB *cbb, const EVP_PKEY *key)) {
  std::vector<uint8_t> input;
  if (!t->GetBytes(&input, "Input")) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, input.data(), input.size());
  bssl::UniquePtr<EVP_PKEY> pkey(parse_func(&cbs));
  if (!pkey) {
    return false;
  }

  std::string key_type;
  if (!t->GetAttribute(&key_type, "Type")) {
    return false;
  }
  EXPECT_EQ(GetKeyType(t, key_type), EVP_PKEY_id(pkey.get()));

  // The key must re-encode correctly.
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !marshal_func(cbb.get(), pkey.get()) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_der(der);

  std::vector<uint8_t> output = input;
  if (t->HasAttribute("Output") &&
      !t->GetBytes(&output, "Output")) {
    return false;
  }
  EXPECT_EQ(Bytes(output), Bytes(der, der_len))
      << "Re-encoding the key did not match.";

  if (t->HasAttribute("ExpectNoRawPrivate")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPrivate")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPrivate")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_private_key(pkey.get(), raw.data(), &len));
  }

  if (t->HasAttribute("ExpectNoRawPublic")) {
    size_t len;
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len));
  } else if (t->HasAttribute("ExpectRawPublic")) {
    std::vector<uint8_t> expected;
    if (!t->GetBytes(&expected, "ExpectRawPublic")) {
      return false;
    }

    std::vector<uint8_t> raw;
    size_t len;
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), nullptr, &len)) {
      return false;
    }
    raw.resize(len);
    if (!EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len)) {
      return false;
    }
    raw.resize(len);
    EXPECT_EQ(Bytes(raw), Bytes(expected));

    // Short buffers should be rejected.
    raw.resize(len - 1);
    len = raw.size();
    EXPECT_FALSE(EVP_PKEY_get_raw_public_key(pkey.get(), raw.data(), &len));
  }

  // Save the key for future tests.
  const std::string &key_name = t->GetParameter();
  EXPECT_EQ(0u, key_map->count(key_name)) << "Duplicate key: " << key_name;
  (*key_map)[key_name] = std::move(pkey);
  return true;
}